

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalOperationalData.cpp
# Opt level: O1

void __thiscall
DIS::FundamentalOperationalData::marshal(FundamentalOperationalData *this,DataStream *dataStream)

{
  DataStream::operator<<(dataStream,this->_systemStatus);
  DataStream::operator<<(dataStream,this->_dataField1);
  DataStream::operator<<(dataStream,this->_informationLayers);
  DataStream::operator<<(dataStream,this->_dataField2);
  DataStream::operator<<(dataStream,this->_parameter1);
  DataStream::operator<<(dataStream,this->_parameter2);
  DataStream::operator<<(dataStream,this->_parameter3);
  DataStream::operator<<(dataStream,this->_parameter4);
  DataStream::operator<<(dataStream,this->_parameter5);
  DataStream::operator<<(dataStream,this->_parameter6);
  return;
}

Assistant:

void FundamentalOperationalData::marshal(DataStream& dataStream) const
{
    dataStream << _systemStatus;
    dataStream << _dataField1;
    dataStream << _informationLayers;
    dataStream << _dataField2;
    dataStream << _parameter1;
    dataStream << _parameter2;
    dataStream << _parameter3;
    dataStream << _parameter4;
    dataStream << _parameter5;
    dataStream << _parameter6;
}